

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QDialogButtonBox::StandardButton>::reallocate_impl
          (QVLABase<QDialogButtonBox::StandardButton> *this,qsizetype prealloc,void *array,
          qsizetype asize,qsizetype aalloc)

{
  StandardButton *capacity;
  size_t headerSize;
  longlong *plVar1;
  StandardButton *pSVar2;
  StandardButton *in_RDX;
  size_t in_RSI;
  QVLABaseBase *in_RDI;
  size_t in_R8;
  long in_FS_OFFSET;
  qsizetype newA;
  void *newPtr;
  qsizetype copySize;
  qsizetype oalloc;
  StandardButton *oldPtr;
  malloced_ptr guard;
  qsizetype osize;
  pointer in_stack_ffffffffffffff88;
  qsizetype *capacity_00;
  size_type local_20;
  size_t local_18;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_R8;
  capacity = data((QVLABase<QDialogButtonBox::StandardButton> *)in_RDI);
  local_20 = QVLABaseBase::size(in_RDI);
  headerSize = QVLABaseBase::capacity(in_RDI);
  plVar1 = qMin<long_long>(&local_10,&local_20);
  capacity_00 = (qsizetype *)*plVar1;
  if (local_18 != headerSize) {
    std::unique_ptr<void,QVLABaseBase::free_deleter>::unique_ptr<QVLABaseBase::free_deleter,void>
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_RDI);
    pSVar2 = in_RDX;
    if ((long)in_RSI < (long)local_18) {
      pSVar2 = (StandardButton *)
               QtPrivate::fittedMalloc(headerSize,capacity_00,0xaaaaaaaaaaaaaaaa,0xaaaaaaaaaaaaaaaa)
      ;
      std::unique_ptr<void,_QVLABaseBase::free_deleter>::reset
                ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_RDI,in_stack_ffffffffffffff88);
      qt_noop();
      in_RSI = local_18;
    }
    QtPrivate::q_uninitialized_relocate_n<QDialogButtonBox::StandardButton,long_long>
              ((StandardButton *)in_RDI,(longlong)in_stack_ffffffffffffff88,
               (StandardButton *)0x672f0b);
    in_RDI->ptr = pSVar2;
    std::unique_ptr<void,_QVLABaseBase::free_deleter>::release
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)0x672f23);
    in_RDI->a = in_RSI;
    std::unique_ptr<void,_QVLABaseBase::free_deleter>::~unique_ptr
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_RDI);
  }
  in_RDI->s = (qsizetype)capacity_00;
  if ((capacity != in_RDX) &&
     (pSVar2 = data((QVLABase<QDialogButtonBox::StandardButton> *)in_RDI), capacity != pSVar2)) {
    QtPrivate::sizedFree(in_RDI,(size_t)capacity,0x672f87);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}